

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

transition_table_type<vending::events::start_maintenance> *
afsm::transitions::
state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>
::transition_table<vending::events::start_maintenance,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  if (transition_table<vending::events::start_maintenance,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
      ::_table == '\0') {
    transition_table<vending::events::start_maintenance,0ul,1ul>();
  }
  return &state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
          ::transition_table<vending::events::start_maintenance,_0UL,_1UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }